

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestEmptyBinaryDirectoryCommand.h
# Opt level: O2

void __thiscall
cmCTestEmptyBinaryDirectoryCommand::~cmCTestEmptyBinaryDirectoryCommand
          (cmCTestEmptyBinaryDirectoryCommand *this)

{
  cmCommand::~cmCommand((cmCommand *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

cmCTestEmptyBinaryDirectoryCommand() {}